

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::ShuffleVectorInst::ShuffleVectorInst
          (ShuffleVectorInst *this,Type *type,Value *a,Value *b,Value *shuf)

{
  uint uVar1;
  uint uVar2;
  ConstantDataVector *this_00;
  Constant *pCVar3;
  APInt *this_01;
  int64_t iVar4;
  uint i;
  Value *local_58;
  Value *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  Instruction::Instruction(&this->super_Instruction,type,ShuffleVector);
  (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_58 = a;
  local_50 = b;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_48,
             &local_58);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_48);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_48);
  this_00 = cast<LLVMBC::ConstantDataVector>(shuf);
  uVar1 = ConstantDataVector::getNumElements(this_00);
  std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::reserve(&this->shuffle_mask,(ulong)uVar1);
  uVar1 = 0;
  while( true ) {
    uVar2 = ConstantDataVector::getNumElements(this_00);
    if (uVar2 <= uVar1) break;
    pCVar3 = ConstantDataVector::getElementAsConstant(this_00,uVar1);
    pCVar3 = &cast<LLVMBC::ConstantInt>(&pCVar3->super_Value)->super_Constant;
    this_01 = Constant::getUniqueInteger(pCVar3);
    iVar4 = APInt::getSExtValue(this_01);
    local_58 = (Value *)CONCAT44(local_58._4_4_,(int)iVar4);
    std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::emplace_back<int>
              (&this->shuffle_mask,(int *)&local_58);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

ShuffleVectorInst::ShuffleVectorInst(Type *type, Value *a, Value *b, Value *shuf)
	: Instruction(type, ValueKind::ShuffleVector)
{
	set_operands({ a, b });
	auto *masks = cast<ConstantDataVector>(shuf);
	shuffle_mask.reserve(masks->getNumElements());
	for (unsigned i = 0; i < masks->getNumElements(); i++)
		shuffle_mask.push_back(cast<ConstantInt>(masks->getElementAsConstant(i))->getUniqueInteger().getSExtValue());
}